

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O3

void __thiscall xemmai::t_module::t_module(t_module *this,iterator a_entry,t_object *a_body)

{
  t_object *ptVar1;
  _Base_ptr p_Var2;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_slot *ptVar3;
  long in_FS_OFFSET;
  
  (this->v_entry)._M_node = a_entry._M_node;
  t_slot::t_slot(&this->v_body,a_body);
  p_Var2 = (this->v_entry)._M_node;
  ptVar3 = &this[-5].v_body;
  if ((t_slot *)0x4 < ptVar3) {
    this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
    *this_00->v_head = (t_object *)ptVar3;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  LOCK();
  p_Var2 = p_Var2 + 2;
  ptVar1 = *(t_object **)p_Var2;
  *(t_slot **)p_Var2 = ptVar3;
  UNLOCK();
  if ((t_object *)0x4 < ptVar1) {
    this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
    *this_01->v_head = ptVar1;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
      return;
    }
    this_01->v_head = this_01->v_head + 1;
  }
  return;
}

Assistant:

t_module(std::map<std::wstring, t_slot, std::less<>>::iterator a_entry, t_object* a_body) : v_entry(a_entry), v_body(a_body)
	{
		v_entry->second = t_object::f_of(this);
	}